

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remaining_time_counter.hpp
# Opt level: O2

void __thiscall so_5::details::remaining_time_counter_t::update(remaining_time_counter_t *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  lVar3 = lVar1 - (this->m_last_time).__d.__r;
  (this->m_last_time).__d.__r = lVar1;
  lVar1 = (this->m_remaining).__r;
  lVar2 = lVar1 - lVar3;
  lVar4 = 0;
  if (lVar2 != 0 && lVar3 <= lVar1) {
    lVar4 = lVar2;
  }
  (this->m_remaining).__r = lVar4;
  return;
}

Assistant:

void
		update()
			{
				const auto now = std::chrono::steady_clock::now();
				const auto elapsed = now - m_last_time;
				m_last_time = now;

				if( elapsed < m_remaining )
					m_remaining -= elapsed;
				else
					m_remaining = duration::zero();
			}